

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_2.c
# Opt level: O2

longlong clear_flag(longlong wflg,longlong wbig,longlong *W,longlong n)

{
  long lVar1;
  longlong lStack_8;
  
  if (wflg < 2 || wbig <= wflg) {
    lVar1 = 0;
    if (n < 1) {
      n = lVar1;
    }
    lStack_8 = 2;
    for (; wflg = lStack_8, n != lVar1; lVar1 = lVar1 + 1) {
      if (W[lVar1] != 0) {
        W[lVar1] = 1;
      }
    }
  }
  return wflg;
}

Assistant:

static Int clear_flag (Int wflg, Int wbig, Int W [ ], Int n)
{
    Int x ;
    if (wflg < 2 || wflg >= wbig)
    {
	for (x = 0 ; x < n ; x++)
	{
	    if (W [x] != 0) W [x] = 1 ;
	}
	wflg = 2 ;
    }
    /*  at this point, W [0..n-1] < wflg holds */
    return (wflg) ;
}